

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O1

bool IsAddressOnStack(ULONG_PTR address)

{
  ulong uVar1;
  ULONG_PTR local_28;
  ULONG_PTR lowLimit;
  ULONG_PTR highLimit;
  
  GetCurrentThreadStackLimits(&local_28,&lowLimit);
  uVar1 = GetCurrentSP();
  return address < lowLimit && uVar1 <= address;
}

Assistant:

bool IsAddressOnStack(ULONG_PTR address)
{
    // Assumption: Stack always grows, never shrinks and the high limit is stable
    // Assumption: pthread_getattr_np is slow, so we need to cache the current stack
    // bounds to speed up checking if a given address is on the stack
    // The semantics of IsAddressOnStack is that we care if a given address is
    // in the range of the current stack pointer
    ULONG_PTR lowLimit, highLimit;
    GetCurrentThreadStackLimits(&lowLimit, &highLimit);

    ULONG_PTR currentStackPtr = GetCurrentSP();

    if (currentStackPtr <= address && address < highLimit)
    {
        return true;
    }

    return false;
}